

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Type * struct_decl(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  C_Type *pCVar4;
  int iVar5;
  int iVar6;
  C_Member *pCVar7;
  
  pCVar4 = struct_union_decl(parser,rest,tok);
  pCVar4->kind = TY_STRUCT;
  if (-1 < pCVar4->size) {
    pCVar7 = pCVar4->members;
    if (pCVar7 == (C_Member *)0x0) {
      iVar5 = -1;
    }
    else {
      _Var1 = pCVar4->is_packed;
      iVar5 = 0;
      do {
        if (pCVar7->is_bitfield == true) {
          if (pCVar7->bit_width == 0) {
            iVar3 = pCVar7->ty->size;
            iVar5 = iVar5 + -1 + iVar3 * 8;
            iVar5 = iVar5 - iVar5 % (iVar3 << 3);
          }
          else {
            iVar2 = pCVar7->ty->size;
            iVar3 = iVar2 * 8;
            if (iVar5 / iVar3 != (iVar5 + -1 + pCVar7->bit_width) / iVar3) {
              iVar5 = iVar5 + -1 + iVar3;
              iVar5 = iVar5 - iVar5 % iVar3;
            }
            iVar6 = iVar5 + 7;
            if (-1 < iVar5) {
              iVar6 = iVar5;
            }
            pCVar7->offset = (iVar6 >> 3) - (int)(CONCAT44(iVar6 >> 0x1f,iVar6 >> 3) % (long)iVar2);
            pCVar7->bit_offset = iVar5 % iVar3;
            iVar5 = pCVar7->bit_width + iVar5;
          }
        }
        else {
          if (pCVar4->is_packed == false) {
            iVar5 = iVar5 + -1 + pCVar7->align * 8;
            iVar5 = iVar5 - iVar5 % (pCVar7->align << 3);
          }
          iVar3 = iVar5 + 7;
          if (-1 < iVar5) {
            iVar3 = iVar5;
          }
          pCVar7->offset = iVar3 >> 3;
          iVar5 = iVar5 + pCVar7->ty->size * 8;
        }
        if ((_Var1 == false) && (pCVar4->align < pCVar7->align)) {
          pCVar4->align = pCVar7->align;
        }
        pCVar7 = pCVar7->next;
      } while (pCVar7 != (C_Member *)0x0);
      iVar5 = iVar5 + -1;
    }
    iVar5 = iVar5 + pCVar4->align * 8;
    iVar5 = iVar5 - iVar5 % (pCVar4->align << 3);
    iVar3 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    pCVar4->size = iVar3 >> 3;
  }
  return pCVar4;
}

Assistant:

static C_Type *struct_decl(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = struct_union_decl(parser, rest, tok);
  ty->kind = TY_STRUCT;

  if (ty->size < 0)
    return ty;

  // Assign offsets within the struct to members.
  int bits = 0;

  for (C_Member *mem = ty->members; mem; mem = mem->next) {
    if (mem->is_bitfield && mem->bit_width == 0) {
      // Zero-width anonymous bitfield has a special meaning.
      // It affects only alignment.
      bits = C_align_to(bits, mem->ty->size * 8);
    } else if (mem->is_bitfield) {
      int sz = mem->ty->size;
      if (bits / (sz * 8) != (bits + mem->bit_width - 1) / (sz * 8))
        bits = C_align_to(bits, sz * 8);

      mem->offset = align_down(bits / 8, sz);
      mem->bit_offset = bits % (sz * 8);
      bits += mem->bit_width;
    } else {
      if (!ty->is_packed)
        bits = C_align_to(bits, mem->align * 8);
      mem->offset = bits / 8;
      bits += mem->ty->size * 8;
    }

    if (!ty->is_packed && ty->align < mem->align)
      ty->align = mem->align;
  }

  ty->size = C_align_to(bits, ty->align * 8) / 8;
  return ty;
}